

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void list_empty(list *list)

{
  list *list_local;
  
  clear_list(list,false);
  return;
}

Assistant:

void list_empty(struct list *list)
{
        clear_list(list, false);
}